

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  int *piVar1;
  int in_ESI;
  DeathTestImpl *in_RDI;
  bool bVar2;
  int gtest_retval;
  char status_ch;
  void *in_stack_fffffffffffffea8;
  allocator *in_stack_fffffffffffffeb0;
  undefined1 local_142;
  undefined1 local_141;
  string local_130 [8];
  int *in_stack_fffffffffffffed8;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  undefined1 local_d;
  
  if (in_ESI == 2) {
    local_141 = 0x4c;
  }
  else {
    local_142 = 0x54;
    if (in_ESI != 1) {
      local_142 = 0x52;
    }
    local_141 = local_142;
  }
  local_d = local_141;
  do {
    do {
      write_fd(in_RDI);
      local_14 = posix::Write((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                              in_stack_fffffffffffffea8,0);
      bVar2 = false;
      if (local_14 == -1) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (local_14 == -1) {
      in_stack_fffffffffffffeb0 = &local_f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"CHECK failed: File ",in_stack_fffffffffffffeb0);
      std::operator+(&local_d8,&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_b8,&local_d8,", line ");
      StreamableToString<int>(in_stack_fffffffffffffed8);
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"posix::Write(write_fd(), &status_ch, 1)");
      std::operator+(&local_38,&local_58," != -1");
      DeathTestAbort((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    bVar2 = AlwaysFalse();
  } while (bVar2);
  _exit(1);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}